

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>
               (void)

{
  uint *__args_2;
  _Base_ptr p_Var1;
  Column_settings *pCVar2;
  Column_settings *pCVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  pointer __args;
  undefined4 local_4c4;
  undefined4 *local_4c0;
  _Base_ptr local_4b8;
  undefined **local_4b0;
  ulong local_4a8;
  shared_count sStack_4a0;
  undefined4 **local_498;
  undefined8 local_490;
  uint local_488 [2];
  undefined8 *local_480;
  _Base_ptr *local_478;
  undefined1 local_470 [8];
  undefined8 local_468;
  shared_count sStack_460;
  char *local_458;
  char *local_450;
  undefined **local_448;
  char *local_440;
  undefined8 *local_438;
  char *local_430;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3f8;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>
  ::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>
              *)&m.matrix_,&local_3f8,m.colSettings_);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>
            (&local_3f8,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_Chain_vine_swap_option.super_type.
      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      .barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.matrix_.super_Chain_vine_swap_option.super_type.
      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
      .barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = m.matrix_.super_Chain_vine_swap_option.super_type.
             super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
             .barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __args_2 = &__args->death;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,&__args->dim,&__args->birth,__args_2);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,&__args->dim,&__args->birth,__args_2);
      local_488[0] = *__args_2;
      local_490._0_4_ = __args->dim;
      local_490._4_4_ = __args->birth;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,false>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_490,(uint *)((long)&local_490 + 4),local_488);
      __args = __args + 1;
    } while (__args != m.matrix_.super_Chain_vine_swap_option.super_type.
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
                       .barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x574);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4b8 = (_Base_ptr)&p_Var1[1]._M_parent;
  local_4c0 = &local_4c4;
  local_4c4 = 0;
  local_470[0] = *(int *)&p_Var1[1]._M_parent == 0;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_478 = &local_4b8;
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_498 = &local_4c0;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x575);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 0;
  local_470[0] = *(int *)&p_Var1[1].field_0x4 == 0;
  local_4b8 = (_Base_ptr)&p_Var1[1].field_0x4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x577);
  local_4b8 = p_Var1 + 1;
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 0xffffffff;
  local_470[0] = local_4b8->_M_color == ~_S_red;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x579);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 0;
  local_470[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4b8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x57a);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 1;
  local_470[0] = *(int *)&p_Var5[1].field_0x4 == 1;
  local_4b8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x57b);
  local_4b8 = p_Var5 + 1;
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 3;
  local_470[0] = local_4b8->_M_color == 3;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x57d);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 0;
  local_470[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4b8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x57e);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 2;
  local_470[0] = *(int *)&p_Var5[1].field_0x4 == 2;
  local_4b8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x57f);
  local_4b8 = p_Var5 + 1;
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 4;
  local_470[0] = local_4b8->_M_color == 4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x581);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 0;
  local_470[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4b8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x582);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 7;
  local_470[0] = *(int *)&p_Var5[1].field_0x4 == 7;
  local_4b8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x583);
  local_4b8 = p_Var5 + 1;
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 8;
  local_470[0] = local_4b8->_M_color == 8;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x585);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 1;
  local_470[0] = *(int *)&p_Var5[1]._M_parent == 1;
  local_4b8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x586);
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 5;
  local_470[0] = *(int *)&p_Var5[1].field_0x4 == 5;
  local_4b8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x587);
  local_4b8 = p_Var5 + 1;
  local_440 = (char *)((ulong)local_440 & 0xffffffffffffff00);
  local_448 = &PTR__lazy_ostream_001946e0;
  local_438 = &boost::unit_test::lazy_ostream::inst;
  local_430 = "";
  local_4c4 = 6;
  local_470[0] = local_4b8->_M_color == 6;
  local_468 = 0;
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001946a0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = &local_4b8;
  local_4c0 = &local_4c4;
  local_4a8 = local_4a8 & 0xffffffffffffff00;
  local_4b0 = &PTR__lazy_ostream_001946a0;
  sStack_4a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_498 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (local_470,&local_448,&local_458,0x587,1,2,2,"std::get<2>(*it)",&local_490,"6",
             &local_4b0);
  boost::detail::shared_count::~shared_count(&sStack_460);
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x589);
  local_4b0 = (undefined **)
              CONCAT71(local_4b0._1_7_,
                       (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_448 = (undefined **)0x178578;
  local_440 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001947e0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_478 = (_Base_ptr *)&local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_4b0 = (undefined **)CONCAT71(local_4b0._1_7_,bVar4);
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_448 = (undefined **)0x17858a;
  local_440 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001947e0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_340 = "";
  local_478 = (_Base_ptr *)&local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_4b0 = (undefined **)CONCAT71(local_4b0._1_7_,bVar4);
  local_4a8 = 0;
  sStack_4a0.pi_ = (sp_counted_base *)0x0;
  local_448 = (undefined **)0x178599;
  local_440 = "";
  local_488[0] = local_488[0] & 0xffffff00;
  local_490 = &PTR__lazy_ostream_001947e0;
  local_480 = &boost::unit_test::lazy_ostream::inst;
  local_478 = (_Base_ptr *)&local_448;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4a0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  pCVar2 = m.colSettings_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>_>_>
  ::_M_erase_at_end(&m.matrix_.matrix_,
                    m.matrix_.matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pCVar3 = m.colSettings_;
  if (m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    m.matrix_.pivotToColumnIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         m.matrix_.pivotToColumnIndex_.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  m.matrix_.nextIndex_ = 0;
  m.matrix_.colSettings_ = pCVar2;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
  }
  operator_delete(pCVar3,0x38);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_false>_>_>
  ::~Chain_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_3f8);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}